

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O0

void __thiscall avro::StreamWriter::more(StreamWriter *this)

{
  ulong uVar1;
  Exception *this_00;
  undefined8 *in_RDI;
  size_t n;
  string *in_stack_ffffffffffffff98;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  long local_10 [2];
  
  local_10[0] = 0;
  do {
    uVar1 = (**(code **)(*(long *)*in_RDI + 0x10))((long *)*in_RDI,in_RDI + 1,local_10);
    if ((uVar1 & 1) == 0) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      Exception::Exception(this_00,in_stack_ffffffffffffff98);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  } while (local_10[0] == 0);
  in_RDI[2] = in_RDI[1] + local_10[0];
  return;
}

Assistant:

void more() {
        size_t n = 0;
        while (out_->next(&next_, &n)) {
            if (n != 0) {
                end_ = next_ + n;
                return;
            }
        }
        throw Exception("EOF reached");
    }